

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bool.cc
# Opt level: O0

int d2i_ASN1_BOOLEAN(int *a,uchar **pp,long length)

{
  int iVar1;
  uint8_t *puVar2;
  int local_3c;
  ASN1_BOOLEAN ret;
  int val;
  CBS cbs;
  long len_local;
  uchar **inp_local;
  ASN1_BOOLEAN *out_local;
  
  if (length < 0) {
    out_local._4_4_ = -1;
  }
  else {
    cbs.len = length;
    CBS_init((CBS *)&ret,*pp,length);
    iVar1 = CBS_get_asn1_bool((CBS *)&ret,&local_3c);
    if (iVar1 == 0) {
      ERR_put_error(0xc,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bool.cc"
                    ,0x2b);
      out_local._4_4_ = -1;
    }
    else {
      out_local._4_4_ = 0;
      if (local_3c != 0) {
        out_local._4_4_ = 0xff;
      }
      if (a != (int *)0x0) {
        *a = out_local._4_4_;
      }
      puVar2 = CBS_data((CBS *)&ret);
      *pp = puVar2;
    }
  }
  return out_local._4_4_;
}

Assistant:

ASN1_BOOLEAN d2i_ASN1_BOOLEAN(ASN1_BOOLEAN *out, const unsigned char **inp,
                              long len) {
  if (len < 0) {
    return ASN1_BOOLEAN_NONE;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  int val;
  if (!CBS_get_asn1_bool(&cbs, &val)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return ASN1_BOOLEAN_NONE;
  }

  ASN1_BOOLEAN ret = val ? ASN1_BOOLEAN_TRUE : ASN1_BOOLEAN_FALSE;
  if (out != NULL) {
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}